

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_graph.h
# Opt level: O0

void __thiscall PP_point::PP_point(PP_point *this,PP_point *other)

{
  size_type sVar1;
  reference __x;
  uint local_1c;
  uint i;
  PP_point *other_local;
  PP_point *this_local;
  
  this->_vptr_PP_point = (_func_int **)&PTR__PP_point_00125c18;
  std::vector<PP_edge,_std::allocator<PP_edge>_>::vector(&this->e);
  this->x = other->x;
  this->y = other->y;
  this->z = other->z;
  std::vector<PP_edge,_std::allocator<PP_edge>_>::clear(&this->e);
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<PP_edge,_std::allocator<PP_edge>_>::size(&other->e);
    if (sVar1 <= local_1c) break;
    __x = std::vector<PP_edge,_std::allocator<PP_edge>_>::at(&other->e,(ulong)local_1c);
    std::vector<PP_edge,_std::allocator<PP_edge>_>::push_back(&this->e,__x);
    local_1c = local_1c + 1;
  }
  this->canBePartOfGraph = (bool)(other->canBePartOfGraph & 1);
  return;
}

Assistant:

PP_point( PP_point& other )
    {
        this->x = other.x;
        this->y = other.y;
        this->z = other.z;
        this->e.clear();
        for(unsigned int i=0 ; i<other.e.size() ; i++)
            this->e.push_back(other.e.at(i));
        this->canBePartOfGraph = other.canBePartOfGraph;
    }